

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O3

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::ModuleSplitter::ModuleSplitter
          (ModuleSplitter *this,Module *primary,Config *config)

{
  _Base_ptr p_Var1;
  undefined8 *puVar2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *pvVar3;
  size_type *psVar4;
  pointer *pppEVar5;
  _Rb_tree_header *p_Var6;
  bool *__k;
  Id IVar7;
  pointer puVar8;
  __uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_> _Var9;
  pointer puVar10;
  char *pcVar11;
  pointer puVar12;
  ElementSegment *pEVar13;
  iterator __position;
  pointer ppEVar14;
  char *pcVar15;
  undefined8 uVar16;
  pointer puVar17;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *psVar18;
  _Head_base<0UL,_wasm::Export_*,_false> _Var19;
  uintptr_t uVar20;
  pointer puVar21;
  _Head_base<0UL,_wasm::Global_*,_false> _Var22;
  _Head_base<0UL,_wasm::Function_*,_false> _Var23;
  pointer ppEVar24;
  pointer puVar25;
  _Head_base<0UL,_wasm::DataSegment_*,_false> _Var26;
  pointer pNVar27;
  Global *pGVar28;
  DataSegment *pDVar29;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *p_Var30;
  HeapType HVar31;
  pointer puVar32;
  pointer puVar33;
  Tag *primaryItem;
  undefined1 auVar34 [16];
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  Slot slot;
  void *pvVar38;
  Name table;
  _Base_ptr p_Var39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  Expression EVar43;
  _Alloc_hider _Var44;
  pointer puVar45;
  char cVar46;
  char cVar47;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exportFunc;
  Module *pMVar48;
  _Rb_tree_node_base *p_Var49;
  pointer puVar50;
  size_type sVar51;
  size_t *psVar52;
  Export *pEVar53;
  mapped_type *pmVar54;
  Const *pCVar55;
  Function *pFVar56;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar57;
  Type *pTVar58;
  CallIndirect *pCVar59;
  undefined8 *puVar60;
  size_t sVar61;
  Type TVar62;
  __node_base _Var63;
  const_iterator cVar64;
  mapped_type *pmVar65;
  mapped_type *ppFVar66;
  Function *__s;
  long *plVar67;
  ElementSegment *pEVar68;
  pointer ppEVar69;
  RefFunc *pRVar70;
  ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  *pPVar71;
  Expression *pEVar72;
  mapped_type *pmVar73;
  Memory *secondaryItem;
  Table *pTVar74;
  _Base_ptr p_Var75;
  undefined1 uVar76;
  _Rb_tree_color _Var77;
  uint uVar78;
  __hash_code __code;
  long lVar79;
  pointer puVar80;
  pointer puVar81;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar82;
  string_view *psVar83;
  pointer puVar84;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *puVar85;
  ulong uVar86;
  _Base_ptr p_Var87;
  uint uVar88;
  int iVar89;
  const_iterator __begin2_1;
  char **ppcVar90;
  variant<wasm::Name,_wasm::HeapType> *pvVar91;
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  *this_00;
  _Base_ptr *pp_Var92;
  ulong uVar93;
  undefined1 *puVar94;
  pointer puVar95;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_2;
  size_t sVar96;
  pointer puVar97;
  pointer puVar98;
  pointer puVar99;
  const_iterator __end2_1;
  pointer ppEVar100;
  DylinkSection *pDVar101;
  Index index;
  iterator __begin2;
  pointer puVar102;
  bool bVar103;
  Name name;
  string_view sVar104;
  string_view s;
  string_view sVar105;
  Name NVar106;
  Signature SVar107;
  IString IVar108;
  Name NVar109;
  Name name_00;
  Name name_01;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  Builder local_2a0;
  Builder builder_2;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *functionExportNames;
  undefined1 auStack_288 [8];
  ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  segmentReferrerCollector;
  Index IStack_248;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_1a8;
  DylinkSection *local_170;
  DylinkSection *local_168;
  undefined8 local_160;
  TableSlotManager *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  iterator __end2;
  _Alloc_hider _Stack_138;
  vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_> relevantRefFuncs;
  undefined1 auStack_118 [8];
  Type params;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Base_ptr local_f8;
  pointer local_f0;
  undefined1 auStack_e8 [8];
  Expression *copied;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment_1;
  undefined1 auStack_b8 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> primaryFuncs;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  segmentReferrers;
  
  this->config = config;
  segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)config
  ;
  pMVar48 = (Module *)operator_new(0x3f0);
  memset(pMVar48,0,0x3f0);
  Module::Module(pMVar48);
  (this->secondaryPtr)._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl = pMVar48;
  (pMVar48->features).features = (primary->features).features;
  pMVar48->hasFeaturesSection = primary->hasFeaturesSection;
  this->primary = primary;
  this->secondary = pMVar48;
  auStack_e8 = (undefined1  [8])0x0;
  copied = (Expression *)0x0;
  local_d8._8_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:403:16)>
       ::_M_invoke;
  local_d8._0_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:403:16)>
       ::_M_manager;
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)auStack_288,primary,(Func *)auStack_e8);
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    (*(code *)local_d8._0_8_)(auStack_e8,auStack_e8,3);
  }
  __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              *)&segmentReferrers._M_h._M_rehash_policy._M_next_resize;
  segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x1;
  segmentReferrers._M_h._M_bucket_count = 0;
  segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  segmentReferrers._M_h._M_element_count =
       CONCAT44(segmentReferrers._M_h._M_element_count._4_4_,0x3f800000);
  segmentReferrers._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  segmentReferrers._M_h._M_rehash_policy._4_4_ = 0;
  segmentReferrers._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var49 = (_Rb_tree_node_base *)
            CONCAT44(segmentReferrerCollector._28_4_,segmentReferrerCollector._24_4_);
  if (p_Var49 != (_Rb_tree_node_base *)&segmentReferrerCollector.field_0x8) {
    do {
      p_Var87 = p_Var49[1]._M_left;
      auStack_b8 = (undefined1  [8])&__range2;
      for (p_Var75 = p_Var49[1]._M_parent; p_Var75 != p_Var87;
          p_Var75 = (_Base_ptr)&p_Var75->_M_left) {
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&__range2,p_Var75,auStack_b8);
      }
      p_Var49 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var49);
    } while (p_Var49 != (_Rb_tree_node_base *)&segmentReferrerCollector.field_0x8);
  }
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&primaryFuncs;
  primaryFuncs._M_t._M_impl._0_8_ = (ulong)(uint)primaryFuncs._M_t._M_impl._4_4_ << 0x20;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_f8 = (_Base_ptr)&params;
  params.id = (ulong)params.id._4_4_ << 0x20;
  local_108._M_allocated_capacity._0_7_ = 0;
  local_108._8_3_ = SUB83(local_f8,0);
  local_108._7_4_ = (uint)(uint3)local_108._8_3_ << 8;
  local_108._M_local_buf[0xb] = (char)((ulong)local_f8 >> 0x18);
  local_108._12_4_ = (undefined4)((ulong)local_f8 >> 0x20);
  local_f0 = (pointer)0x0;
  puVar97 = (primary->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (primary->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (puVar97 == puVar8) {
LAB_00747ebc:
    p_Var75 = &(this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header;
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    pp_Var92 = (_Base_ptr *)
               &(this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_node_count;
    _Var77 = _S_red;
    p_Var87 = p_Var75;
  }
  else {
    p_Var1 = (_Base_ptr)(segment_1 + 1);
    do {
      pFVar56 = (puVar97->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      this_00 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                 *)auStack_b8;
      if (*(char **)((long)&(pFVar56->super_Importable).module + 8) == (char *)0x0) {
        cVar64 = std::
                 _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)segment_1,(key_type *)pFVar56);
        if (cVar64._M_node == p_Var1) {
          pFVar56 = (puVar97->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        }
        else {
          if (*(char *)((long)&segment_1[0xf]._M_t.
                               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                       1) == '\0') {
            pFVar56 = (puVar97->_M_t).
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          }
          else {
            puVar50 = (primary->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar17 = (primary->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pFVar56 = (puVar97->_M_t).
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            if (puVar50 != puVar17) {
              do {
                pEVar53 = (puVar50->_M_t).
                          super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                          .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
                if (pEVar53->kind == Function) {
                  if (*(__index_type *)
                       ((long)&(pEVar53->value).super__Variant_base<wasm::Name,_wasm::HeapType> +
                       0x10) == '\0') {
                    pvVar91 = &pEVar53->value;
                  }
                  else {
                    pvVar91 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
                  }
                  if (*(char **)((long)&(pvVar91->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                        super__Move_assign_alias<wasm::Name,_wasm::HeapType> + 8) ==
                      *(char **)((long)&(pFVar56->super_Importable).super_Named + 8))
                  goto LAB_00747d69;
                }
                puVar50 = puVar50 + 1;
              } while (puVar50 != puVar17);
            }
          }
          sVar51 = std::
                   _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)&__range2,(key_type *)pFVar56);
          pFVar56 = (puVar97->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          if ((sVar51 == 0) &&
             (this_00 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                         *)auStack_118,
             *(char **)((long)&(pFVar56->super_Importable).super_Named + 8) ==
             (primary->start).super_IString.str._M_str)) {
            __assert_fail("func->name != primary.start && \"The start function must be kept\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                          ,0x1ce,
                          "static std::pair<std::set<Name>, std::set<Name>> wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::classifyFunctions(Module &, const Config &)"
                         );
          }
        }
      }
LAB_00747d69:
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>(this_00,(Name *)pFVar56);
      puVar97 = puVar97 + 1;
    } while (puVar97 != puVar8);
    if (primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) goto LAB_00747ebc;
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    *(_Rb_tree_header **)(primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 8) =
         &(this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header;
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    pp_Var92 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    p_Var75 = primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var87 = primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    _Var77 = primaryFuncs._M_t._M_impl._0_4_;
    primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&primaryFuncs;
    primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&primaryFuncs;
  }
  (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var75;
  (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var87;
  *pp_Var92 = (_Base_ptr)0x0;
  (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var77;
  p_Var75 = &(this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var87 = (_Base_ptr)CONCAT17(local_108._M_local_buf[7],local_108._M_allocated_capacity._0_7_);
  if (p_Var87 == (_Base_ptr)0x0) {
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    psVar52 = &(this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_node_count;
    uVar93 = 0;
    p_Var87 = p_Var75;
  }
  else {
    psVar52 = (size_t *)&local_f0;
    uVar93 = params.id & 0xffffffff;
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var87;
    p_Var39 = (_Base_ptr)
              CONCAT44(local_108._12_4_,CONCAT13(local_108._M_local_buf[0xb],local_108._8_3_));
    p_Var87->_M_parent = p_Var75;
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)local_f0;
    local_108._M_allocated_capacity._0_7_ = 0;
    local_108._8_3_ = SUB83((_Base_ptr)&params,0);
    local_108._7_4_ = (uint)(uint3)local_108._8_3_ << 8;
    local_108._M_local_buf[0xb] = (char)((ulong)&params >> 0x18);
    local_108._12_4_ = (undefined4)((ulong)&params >> 0x20);
    p_Var75 = p_Var39;
    p_Var87 = local_f8;
    local_f8 = (_Base_ptr)&params;
  }
  (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var75;
  (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var87;
  *psVar52 = 0;
  (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       (_Rb_tree_color)uVar93;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_118);
  uVar76 = (undefined1)uVar93;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_b8);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&__range2);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
               *)&segmentReferrerCollector);
  this->primaryFuncs = &(this->classifiedFuncs).first;
  this->secondaryFuncs = &(this->classifiedFuncs).second;
  (this->tableManager).module = primary;
  p_Var6 = &(this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->tableManager).activeTable = (Table *)0x0;
  (this->tableManager).activeSegment = (ElementSegment *)0x0;
  (this->tableManager).activeBase.tableName.super_IString.str._M_len = 0;
  (this->tableManager).activeBase.tableName.super_IString.str._M_str = (char *)0x0;
  (this->tableManager).activeBase.global.super_IString.str._M_len = 0;
  (this->tableManager).activeBase.global.super_IString.str._M_str = (char *)0x0;
  (this->tableManager).activeBase.index = 0;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var6->_M_header;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->tableManager).activeTableSegments.
  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tableManager).activeTableSegments.
  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tableManager).activeTableSegments.
  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar105 = IString::interned((IString *)&DAT_00000019,(string_view)ZEXT816(0xdbec2d),(bool)uVar76);
  pEVar53 = Module::getExportOrNull(primary,(Name)sVar105);
  puVar81 = (primary->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar79 = (long)(primary->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar81;
  if ((((lVar79 == 8) &&
       (_Var9._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
             (puVar81->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
             _M_t,
       (_Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>)
       _Var9._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
       super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl != (Table *)0x0)) &&
      (*(long *)((long)_Var9._M_t.
                       super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                       super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x20) != 0)) &&
     (sVar105 = IString::interned((IString *)0x3,(string_view)ZEXT816(0xdb5fc0),true),
     *(char **)((long)_Var9._M_t.
                      super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x20) ==
     sVar105._M_str)) {
    sVar105 = IString::interned((IString *)&DAT_00000019,(string_view)ZEXT816(0xdbec2d),
                                SUB81(lVar79,0));
    bVar103 = *(char **)((long)_Var9._M_t.
                               super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                               .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x30) ==
              sVar105._M_str;
  }
  else {
    bVar103 = false;
  }
  local_158 = &this->tableManager;
  __end2._M_current =
       (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
       &(this->tableManager).activeTable;
  if (((bVar103) || (pEVar53 != (Export *)0x0)) || (((primary->features).features & 0x100) == 0)) {
    puVar81 = (primary->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar10 = (primary->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar93 = (long)puVar10 - (long)puVar81;
    if (0 < (long)uVar93 >> 5) {
      puVar80 = (pointer)((long)&(puVar81->_M_t).
                                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                 .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl +
                         (uVar93 & 0xffffffffffffffe0));
      lVar79 = ((long)uVar93 >> 5) + 1;
      puVar81 = puVar81 + 2;
      do {
        if (((puVar81[-2]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
              ._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
              super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == 0x12) {
          puVar81 = puVar81 + -2;
          goto LAB_007481ac;
        }
        if (((puVar81[-1]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
              ._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
              super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == 0x12) {
          puVar81 = puVar81 + -1;
          goto LAB_007481ac;
        }
        if ((((puVar81->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
              super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == 0x12)
        goto LAB_007481ac;
        if (((puVar81[1]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
              super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == 0x12) {
          puVar81 = puVar81 + 1;
          goto LAB_007481ac;
        }
        lVar79 = lVar79 + -1;
        puVar81 = puVar81 + 4;
      } while (1 < lVar79);
      uVar93 = (long)puVar10 - (long)puVar80;
      puVar81 = puVar80;
    }
    lVar79 = (long)uVar93 >> 3;
    if (lVar79 == 1) {
LAB_0074816c:
      if ((((puVar81->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
            super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id != 0x12) {
        puVar81 = puVar10;
      }
    }
    else if (lVar79 == 2) {
LAB_0074815e:
      if ((((puVar81->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
            super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id != 0x12) {
        puVar81 = puVar81 + 1;
        goto LAB_0074816c;
      }
    }
    else {
      if (lVar79 != 3) goto LAB_007484af;
      if ((((puVar81->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
            super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id != 0x12) {
        puVar81 = puVar81 + 1;
        goto LAB_0074815e;
      }
    }
LAB_007481ac:
    if (puVar81 != puVar10) {
      pTVar74 = (puVar81->_M_t).
                super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      *__end2._M_current =
           (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>)pTVar74;
      pcVar11 = *(char **)((long)&(pTVar74->super_Importable).super_Named + 8);
      if (pcVar11 == (char *)0x0) {
        __assert_fail("table.is() && \"Table name must not be null\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                      ,0x85,
                      "void wasm::ModuleUtils::iterTableSegments(Module &, Name, T) [T = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:183:32)]"
                     );
      }
      puVar84 = (primary->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar12 = (primary->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar84 != puVar12) {
        do {
          pEVar13 = (puVar84->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
          if (*(char **)((long)&(pEVar13->table).super_IString + 8) == pcVar11) {
            auStack_288._0_4_ = SUB84(pEVar13,0);
            auStack_288._4_4_ = (undefined4)((ulong)pEVar13 >> 0x20);
            __position._M_current =
                 (this->tableManager).activeTableSegments.
                 super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->tableManager).activeTableSegments.
                super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<wasm::ElementSegment*,std::allocator<wasm::ElementSegment*>>::
              _M_realloc_insert<wasm::ElementSegment*const&>
                        ((vector<wasm::ElementSegment*,std::allocator<wasm::ElementSegment*>> *)
                         &(this->tableManager).activeTableSegments,__position,
                         (ElementSegment **)auStack_288);
            }
            else {
              *__position._M_current = pEVar13;
              pppEVar5 = &(this->tableManager).activeTableSegments.
                          super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppEVar5 = *pppEVar5 + 1;
            }
          }
          puVar84 = puVar84 + 1;
        } while (puVar84 != puVar12);
      }
      local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&(this->tableManager).activeBase;
      ppEVar100 = (this->tableManager).activeTableSegments.
                  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppEVar14 = (this->tableManager).activeTableSegments.
                 super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppEVar100 == ppEVar14) {
        pEVar13 = ((__end2._M_current)->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        uVar16 = *(undefined8 *)&(pEVar13->super_Named).name;
        pcVar11 = *(char **)((long)&(pEVar13->super_Named).name + 8);
        auStack_288._0_4_ = (undefined4)uVar16;
        auStack_288._4_4_ = (undefined4)((ulong)uVar16 >> 0x20);
        segmentReferrerCollector.wasm._0_4_ = SUB84(pcVar11,0);
        segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pcVar11 >> 0x20);
        sVar105 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xe67796),SUB81(local_c8,0))
        ;
        *(undefined4 *)local_c8 = auStack_288._0_4_;
        *(undefined4 *)((long)local_c8 + 4) = auStack_288._4_4_;
        *(undefined4 *)((long)local_c8 + 8) = segmentReferrerCollector.wasm._0_4_;
        *(undefined4 *)((long)local_c8 + 0xc) = segmentReferrerCollector.wasm._4_4_;
        (this->tableManager).activeBase.global.super_IString.str = sVar105;
        (this->tableManager).activeBase.index = 0;
      }
      else {
        if (((long)ppEVar14 - (long)ppEVar100 == 8) &&
           (pEVar13 = *ppEVar100, (pEVar13->type).id == 0x12)) {
          IVar7 = pEVar13->offset->_id;
          if (IVar7 == GlobalGetId) {
            (this->tableManager).activeSegment = pEVar13;
            pTVar74 = (this->tableManager).activeTable;
            sVar61 = (pTVar74->super_Importable).super_Named.name.super_IString.str._M_len;
            pcVar11 = (pTVar74->super_Importable).super_Named.name.super_IString.str._M_str;
            auStack_288._0_4_ = (undefined4)sVar61;
            auStack_288._4_4_ = (undefined4)(sVar61 >> 0x20);
            segmentReferrerCollector.wasm._0_4_ = SUB84(pcVar11,0);
            segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pcVar11 >> 0x20);
            pEVar72 = (*ppEVar100)->offset;
            if (pEVar72->_id != GlobalGetId) {
              __assert_fail("int(_id) == int(T::SpecificId)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                            ,0x31b,"T *wasm::Expression::cast() [T = wasm::GlobalGet]");
            }
            uVar16 = *(undefined8 *)(pEVar72 + 1);
            uVar20 = pEVar72[1].type.id;
            EVar43 = pEVar72[1];
            pcVar11 = (pTVar74->super_Importable).super_Named.name.super_IString.str._M_str;
            (((Slot *)local_c8)->tableName).super_IString.str._M_len =
                 (pTVar74->super_Importable).super_Named.name.super_IString.str._M_len;
            (this->tableManager).activeBase.tableName.super_IString.str._M_str = pcVar11;
            segmentReferrerCollector._8_4_ = SUB84(uVar16,0);
            segmentReferrerCollector._12_4_ = SUB84((ulong)uVar16 >> 0x20,0);
            segmentReferrerCollector._16_4_ = SUB84(uVar20,0);
            segmentReferrerCollector._20_4_ = SUB84(uVar20 >> 0x20,0);
            *(undefined4 *)&(this->tableManager).activeBase.global.super_IString.str._M_len =
                 segmentReferrerCollector._8_4_;
            *(undefined4 *)
             ((long)&(this->tableManager).activeBase.global.super_IString.str._M_len + 4) =
                 segmentReferrerCollector._12_4_;
            *(undefined4 *)&(this->tableManager).activeBase.global.super_IString.str._M_str =
                 segmentReferrerCollector._16_4_;
            *(undefined4 *)
             ((long)&(this->tableManager).activeBase.global.super_IString.str._M_str + 4) =
                 segmentReferrerCollector._20_4_;
            (this->tableManager).activeBase.index = 0;
            segmentReferrerCollector._8_16_ = EVar43;
            goto LAB_00748383;
          }
          if (IVar7 != ConstId) {
            __assert_fail("activeTableSegments[0]->offset->is<GlobalGet>() && \"Unexpected initializer instruction\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                          ,199,
                          "wasm::ModuleSplitting::(anonymous namespace)::TableSlotManager::TableSlotManager(Module &)"
                         );
          }
        }
        uVar88 = 0;
        do {
          pEVar13 = *ppEVar100;
          pEVar72 = pEVar13->offset;
          if (pEVar72->_id != ConstId) {
            __assert_fail("segment->offset->is<Const>() && \"Unexpected non-const segment offset with multiple segments\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                          ,0xd4,
                          "wasm::ModuleSplitting::(anonymous namespace)::TableSlotManager::TableSlotManager(Module &)"
                         );
          }
          if (*(long *)(pEVar72 + 2) != 2) goto LAB_0074a45d;
          uVar78 = *(uint *)(pEVar72 + 1);
          lVar79 = (long)(pEVar13->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pEVar13->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          if ((ulong)uVar88 <= lVar79 + (ulong)uVar78) {
            (this->tableManager).activeSegment = pEVar13;
            pTVar74 = (this->tableManager).activeTable;
            sVar61 = (pTVar74->super_Importable).super_Named.name.super_IString.str._M_len;
            pcVar11 = (pTVar74->super_Importable).super_Named.name.super_IString.str._M_str;
            auStack_288._0_4_ = (undefined4)sVar61;
            auStack_288._4_4_ = (undefined4)(sVar61 >> 0x20);
            segmentReferrerCollector.wasm._0_4_ = SUB84(pcVar11,0);
            segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pcVar11 >> 0x20);
            sVar105 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xe67796),
                                        SUB81(pEVar13,0));
            uVar88 = (int)lVar79 + uVar78;
            *(undefined4 *)local_c8 = auStack_288._0_4_;
            *(undefined4 *)((long)local_c8 + 4) = auStack_288._4_4_;
            *(undefined4 *)((long)local_c8 + 8) = segmentReferrerCollector.wasm._0_4_;
            *(undefined4 *)((long)local_c8 + 0xc) = segmentReferrerCollector.wasm._4_4_;
            (this->tableManager).activeBase.global.super_IString.str = sVar105;
            (this->tableManager).activeBase.index = uVar78;
          }
          ppEVar100 = ppEVar100 + 1;
        } while (ppEVar100 != ppEVar14);
      }
LAB_00748383:
      paVar57 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(primary->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      paVar82 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(primary->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      local_150 = paVar82;
      if (paVar57 != paVar82) {
        do {
          pcVar11 = (char *)paVar57->_M_allocated_capacity;
          local_c8 = paVar57;
          if (*(long *)(pcVar11 + 0x20) != 0) {
            sVar105 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xe67796),
                                        SUB81(paVar82,0));
            pcVar15 = *(char **)(pcVar11 + 0x28);
            iVar89 = 0;
            if (*pcVar15 == '\n') {
              sVar105 = *(string_view *)(pcVar15 + 0x10);
            }
            else if (*pcVar15 == '\x0e') {
              if (*(long *)(pcVar15 + 0x20) != 2) goto LAB_0074a45d;
              iVar89 = *(int *)(pcVar15 + 0x10);
            }
            paVar57 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)(pcVar11 + 0x38);
            paVar82 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)(pcVar11 + 0x40);
            if (paVar82 != paVar57) {
              uVar93 = 0;
              uVar86 = 1;
              do {
                pcVar15 = *(char **)((long)paVar57 + uVar93 * 8);
                if (*pcVar15 == '+') {
                  uVar16 = *(undefined8 *)*(undefined1 (*) [16])(pcVar11 + 0x18);
                  auStack_288._0_4_ = (undefined4)uVar16;
                  auStack_288._4_4_ = (undefined4)((ulong)uVar16 >> 0x20);
                  segmentReferrerCollector.wasm._0_4_ = (undefined4)*(undefined8 *)(pcVar11 + 0x20);
                  segmentReferrerCollector.wasm._4_4_ =
                       (undefined4)((ulong)*(undefined8 *)(pcVar11 + 0x20) >> 0x20);
                  slot._36_4_ = segmentReferrerCollector._28_4_;
                  slot.index = iVar89;
                  segmentReferrerCollector._8_8_ = sVar105._M_len;
                  segmentReferrerCollector._16_8_ = sVar105._M_str;
                  slot.global.super_IString.str._M_len = segmentReferrerCollector._8_8_;
                  slot.tableName.super_IString.str =
                       (IString)(IString)*(undefined1 (*) [16])(pcVar11 + 0x18);
                  slot.global.super_IString.str._M_str = (char *)segmentReferrerCollector._16_8_;
                  in_stack_fffffffffffffd28 = auStack_288._0_4_;
                  in_stack_fffffffffffffd2c = auStack_288._4_4_;
                  segmentReferrerCollector._8_16_ = sVar105;
                  segmentReferrerCollector._24_4_ = iVar89;
                  TableSlotManager::addSlot(local_158,(Name)((IString *)(pcVar15 + 0x10))->str,slot)
                  ;
                  paVar57 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              **)(pcVar11 + 0x38);
                  paVar82 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              **)(pcVar11 + 0x40);
                }
                iVar89 = iVar89 + 1;
                bVar103 = uVar86 < (ulong)((long)paVar82 - (long)paVar57 >> 3);
                uVar93 = uVar86;
                uVar86 = (ulong)((int)uVar86 + 1);
              } while (bVar103);
            }
          }
          paVar57 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_c8 + 8);
        } while (paVar57 != local_150);
      }
    }
  }
LAB_007484af:
  (this->minified).state = 0;
  builder_2.wasm = (Module *)&this->exportedPrimaryFuncs;
  puVar50 = (primary->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar17 = (primary->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  p_Var6 = &(this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var6->_M_header;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (; puVar50 != puVar17; puVar50 = puVar50 + 1) {
    pEVar53 = (puVar50->_M_t).
              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (pEVar53->kind == Function) {
      if (*(__index_type *)
           ((long)&(pEVar53->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0')
      {
        pvVar91 = &pEVar53->value;
      }
      else {
        pvVar91 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      pmVar54 = std::
                map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)builder_2.wasm,(key_type *)pvVar91);
      uVar35 = *(undefined4 *)((long)&(pEVar53->name).super_IString + 4);
      uVar36 = *(undefined4 *)((long)&(pEVar53->name).super_IString + 8);
      uVar37 = *(undefined4 *)((long)&(pEVar53->name).super_IString + 0xc);
      *(undefined4 *)&(pmVar54->super_IString).str._M_len =
           *(undefined4 *)&(pEVar53->name).super_IString;
      *(undefined4 *)((long)&(pmVar54->super_IString).str._M_len + 4) = uVar35;
      *(undefined4 *)&(pmVar54->super_IString).str._M_str = uVar36;
      *(undefined4 *)((long)&(pmVar54->super_IString).str._M_str + 4) = uVar37;
    }
  }
  local_150 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&this->placeholderMap;
  p_Var6 = &(this->placeholderMap)._M_t._M_impl.super__Rb_tree_header;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->internalLoadSecondaryModule).super_IString.str._M_len = 0;
  (this->internalLoadSecondaryModule).super_IString.str._M_str = (char *)0x0;
  if (*(char *)((long)&segment_1[0xf]._M_t.
                       super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                       .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 1) ==
      '\x01') {
    NVar106.super_IString.str._M_str = (char *)DAT_010b0ba8.id;
    NVar106.super_IString.str._M_len = (size_t)LOAD_SECONDARY_MODULE;
    pEVar53 = Module::getExportOrNull(this->primary,NVar106);
    HVar31.id = DAT_010b0ba8.id;
    puVar50 = LOAD_SECONDARY_MODULE;
    if ((pEVar53 == (Export *)0x0) || (pEVar53->kind != Function)) {
      HeapType::HeapType((HeapType *)auStack_b8,(Signature)ZEXT816(0));
      auStack_288._0_4_ = 0;
      auStack_288._4_4_ = 0;
      segmentReferrerCollector.wasm._0_4_ = 0;
      segmentReferrerCollector.wasm._4_4_ = 0;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = segmentReferrerCollector._16_8_;
      segmentReferrerCollector._8_16_ = auVar40 << 0x40;
      NVar109.super_IString.str._M_str = (char *)puVar50;
      NVar109.super_IString.str._M_len = (size_t)&__range2;
      Builder::makeFunction
                (NVar109,HVar31,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_b8,
                 (Expression *)auStack_288);
      pvVar38 = (void *)CONCAT44(auStack_288._4_4_,auStack_288._0_4_);
      if (pvVar38 != (void *)0x0) {
        operator_delete(pvVar38,segmentReferrerCollector._8_8_ - (long)pvVar38);
      }
      __range2[1].
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = ENV;
      __range2[1].
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = DAT_010b0e58;
      __range2[1].
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = LOAD_SECONDARY_MODULE;
      __range2[2].
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)DAT_010b0ba8.id;
      Module::addFunction(this->primary,
                          (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                          &__range2);
      puVar50 = (pointer)DAT_010b0ba8.id;
      (this->internalLoadSecondaryModule).super_IString.str._M_len = (size_t)LOAD_SECONDARY_MODULE;
      (this->internalLoadSecondaryModule).super_IString.str._M_str = (char *)puVar50;
      if (__range2 !=
          (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           *)0x0) {
        std::default_delete<wasm::Function>::operator()
                  ((default_delete<wasm::Function> *)&__range2,(Function *)__range2);
      }
    }
    else {
      pvVar91 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      if (*(__index_type *)
           ((long)&(pEVar53->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) == '\0') {
        pvVar91 = &pEVar53->value;
      }
      pcVar11 = *(char **)((long)&(pvVar91->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u + 8)
      ;
      (this->internalLoadSecondaryModule).super_IString.str._M_len =
           *(size_t *)
            &(pvVar91->super__Variant_base<wasm::Name,_wasm::HeapType>).
             super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
             super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
             super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
             super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
             super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
      (this->internalLoadSecondaryModule).super_IString.str._M_str = pcVar11;
      name.super_IString.str._M_str = (char *)DAT_010b0ba8.id;
      name.super_IString.str._M_len = (size_t)LOAD_SECONDARY_MODULE;
      Module::removeExport(this->primary,name);
    }
    puVar17 = DAT_010b0bb8;
    puVar50 = ModuleSplitting::(anonymous_namespace)::LOAD_SECONDARY_STATUS;
    pMVar48 = this->primary;
    auStack_288._0_4_ = SUB84(pMVar48,0);
    auStack_288._4_4_ = (undefined4)((ulong)pMVar48 >> 0x20);
    pCVar55 = Builder::makeConst<int>((Builder *)auStack_288,0);
    __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                *)operator_new(0x50);
    __range2[2].
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __range2[3].
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    __range2[2].
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    __range2[2].
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __range2[1].
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __range2[1].
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__range2->
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __range2[1].
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__range2->
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = puVar50;
    (__range2->
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = puVar17;
    __range2[2].
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
    __range2[2].
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar55;
    *(undefined1 *)
     &__range2[3].
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 1;
    Module::addGlobal(pMVar48,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                              &__range2);
    if (__range2 !=
        (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         *)0x0) {
      operator_delete(__range2,0x50);
    }
    puVar17 = DAT_010b0bb8;
    puVar50 = ModuleSplitting::(anonymous_namespace)::LOAD_SECONDARY_STATUS;
    pMVar48 = this->primary;
    __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                *)operator_new(0x30);
    puVar45 = DAT_010b0bb8;
    __range2[1].
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         ModuleSplitting::(anonymous_namespace)::LOAD_SECONDARY_STATUS;
    __range2[1].
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar45;
    (__range2->
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = puVar50;
    (__range2->
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = puVar17;
    *(undefined4 *)
     &(__range2->
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = 3;
    *(undefined1 *)
     &__range2[1].
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
    Module::addExport(pMVar48,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                              &__range2);
    if (__range2 !=
        (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         *)0x0) {
      operator_delete(__range2,0x30);
    }
  }
  psVar18 = this->secondaryFuncs;
  for (p_Var49 = (psVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var49 != &(psVar18->_M_t)._M_impl.super__Rb_tree_header;
      p_Var49 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var49)) {
    IVar108.str = *(string_view *)(p_Var49 + 1);
    pFVar56 = Module::getFunction(this->primary,(Name)*(string_view *)(p_Var49 + 1));
    segmentReferrerCollector._16_1_ = 0;
    segmentReferrers._M_h._M_before_begin._M_nxt =
         segmentReferrers._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auStack_288;
    wasm::ModuleUtils::copyFunction
              ((ModuleUtils *)pFVar56,(Function *)this->secondary,(Module *)0x0,
               (Name)(auVar34 << 0x40),
               (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&__range2,
               (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    if (((char)segmentReferrers._M_h._M_before_begin._M_nxt == '\x01') &&
       (segmentReferrers._M_h._M_before_begin._M_nxt =
             segmentReferrers._M_h._M_before_begin._M_nxt & 0xffffffffffffff00,
       __range2 !=
       (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        *)0x0)) {
      operator_delete(__range2,segmentReferrers._M_h._M_bucket_count - (long)__range2);
    }
    if (segmentReferrerCollector._16_1_ == '\x01') {
      segmentReferrerCollector._16_1_ = 0;
      pvVar38 = (void *)CONCAT44(auStack_288._4_4_,auStack_288._0_4_);
      if (pvVar38 != (void *)0x0) {
        operator_delete(pvVar38,segmentReferrerCollector._8_8_ - (long)pvVar38);
      }
    }
    Module::removeFunction(this->primary,(Name)IVar108.str);
  }
  pMVar48 = this->primary;
  puVar50 = (pMVar48->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar17 = (pMVar48->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  auStack_b8 = (undefined1  [8])pMVar48;
  if (puVar50 != puVar17) {
    do {
      _Var19._M_head_impl =
           (puVar50->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if ((_Var19._M_head_impl)->kind == Function) {
        p_Var30 = &this->secondaryFuncs->_M_t;
        pvVar91 = &(_Var19._M_head_impl)->value;
        if (*(__index_type *)((long)&(_Var19._M_head_impl)->value + 0x10) != '\0') {
          pvVar91 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        cVar64 = std::
                 _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 ::find(p_Var30,(key_type *)pvVar91);
        if ((_Rb_tree_header *)cVar64._M_node != &(p_Var30->_M_impl).super__Rb_tree_header) {
          _Var19._M_head_impl =
               (puVar50->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          psVar83 = (string_view *)&(_Var19._M_head_impl)->value;
          if (*(__index_type *)((long)&(_Var19._M_head_impl)->value + 0x10) != '\0') {
            psVar83 = (string_view *)0x0;
          }
          pcVar11 = (char *)psVar83->_M_len;
          HVar31.id = (uintptr_t)psVar83->_M_str;
          sVar104 = *psVar83;
          sVar105 = *psVar83;
          pFVar56 = Module::getFunctionOrNull(this->primary,(Name)*psVar83);
          if (pFVar56 == (Function *)0x0) {
            pMVar48 = this->primary;
            pFVar56 = Module::getFunction(this->secondary,(Name)sVar105);
            auStack_288._0_4_ = 0;
            auStack_288._4_4_ = 0;
            segmentReferrerCollector.wasm._0_4_ = 0;
            segmentReferrerCollector.wasm._4_4_ = 0;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = segmentReferrerCollector._16_8_;
            segmentReferrerCollector._8_16_ = auVar41 << 0x40;
            name_00.super_IString.str._M_str = pcVar11;
            name_00.super_IString.str._M_len = (size_t)&__range2;
            Builder::makeFunction
                      (name_00,HVar31,
                       (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar56->type).id,
                       (Expression *)auStack_288);
            paVar57 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)Module::addFunction(pMVar48,(
                                                  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                                  *)&__range2);
            if (__range2 !=
                (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 *)0x0) {
              std::default_delete<wasm::Function>::operator()
                        ((default_delete<wasm::Function> *)&__range2,(Function *)__range2);
            }
            __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        *)0x0;
            pvVar38 = (void *)CONCAT44(auStack_288._4_4_,auStack_288._0_4_);
            if (pvVar38 != (void *)0x0) {
              operator_delete(pvVar38,segmentReferrerCollector._8_8_ - (long)pvVar38);
            }
            __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        *)0x0;
            segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x0;
            segmentReferrers._M_h._M_bucket_count = 0;
            segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         *)(paVar57->_M_local_buf + 0x38);
            SVar107 = HeapType::getSignature((HeapType *)segment_1);
            auStack_118 = (undefined1  [8])SVar107.params.id;
            local_c8 = paVar57;
            sVar61 = wasm::Type::size((Type *)auStack_118);
            if (sVar61 != 0) {
              sVar96 = 0;
              do {
                auStack_288 = (undefined1  [8])auStack_118;
                segmentReferrerCollector.wasm._0_4_ = (undefined4)sVar96;
                uVar35 = segmentReferrerCollector.wasm._0_4_;
                segmentReferrerCollector.wasm._4_4_ = (undefined4)(sVar96 >> 0x20);
                pTVar58 = wasm::Type::Iterator::operator*((Iterator *)auStack_288);
                uVar20 = pTVar58->id;
                auStack_e8 = (undefined1  [8])
                             MixedArena::allocSpace((MixedArena *)((long)auStack_b8 + 0x200),0x18,8)
                ;
                *(Id *)&(((Function *)auStack_e8)->super_Importable).super_Named.name.super_IString.
                        str._M_len = LocalGetId;
                *(undefined4 *)
                 &(((Function *)auStack_e8)->super_Importable).super_Named.hasExplicitName = uVar35;
                ((Type *)&(((Function *)auStack_e8)->super_Importable).super_Named.name.
                          super_IString.str._M_str)->id = uVar20;
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&__range2,
                           (Expression **)auStack_e8);
                sVar96 = sVar96 + 1;
              } while (sVar61 != sVar96);
            }
            TableSlotManager::getSlot
                      ((Slot *)auStack_288,local_158,(Name)sVar104,
                       (HeapType)
                       (segment_1->_M_t).
                       super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                       .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl);
            table.super_IString.str._M_str._0_4_ = segmentReferrerCollector.wasm._0_4_;
            table.super_IString.str._M_len = (size_t)auStack_288;
            table.super_IString.str._M_str._4_4_ = segmentReferrerCollector.wasm._4_4_;
            pEVar72 = TableSlotManager::Slot::makeExpr((Slot *)auStack_288,this->primary);
            pCVar59 = Builder::
                      makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                                ((Builder *)auStack_b8,table,pEVar72,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &__range2,
                                 (HeapType)
                                 (segment_1->_M_t).
                                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl,
                                 false);
            *(CallIndirect **)(local_c8->_M_local_buf + 0x60) = pCVar59;
            if (__range2 !=
                (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 *)0x0) {
              operator_delete(__range2,segmentReferrers._M_h._M_bucket_count - (long)__range2);
            }
          }
        }
      }
      puVar50 = puVar50 + 1;
    } while (puVar50 != puVar17);
    pMVar48 = this->primary;
  }
  _Stack_1a8._M_buckets = &_Stack_1a8._M_single_bucket;
  auStack_288._0_4_ = 0;
  auStack_288._4_4_ = 0;
  segmentReferrerCollector.wasm._0_4_ = 0;
  segmentReferrerCollector.wasm._4_4_ = 0;
  _Stack_1a8._M_bucket_count = 1;
  _Stack_1a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  _Stack_1a8._M_element_count = 0;
  _Stack_1a8._M_rehash_policy._M_max_load_factor = 1.0;
  _Stack_1a8._M_rehash_policy._M_next_resize = 0;
  _Stack_1a8._M_single_bucket = (__node_base_ptr)0x0;
  local_170 = (DylinkSection *)&local_170;
  local_160._0_4_ = 0;
  local_160._4_4_ = 0;
  puVar95 = (pMVar48->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar21 = (pMVar48->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_168 = local_170;
  if (puVar95 != puVar21) {
    do {
      _Var22._M_head_impl =
           (puVar95->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
           super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(_Var22._M_head_impl)->super_Importable + 0x20) == (char *)0x0) {
        Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                  ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)auStack_288,
                   &(_Var22._M_head_impl)->init);
      }
      puVar95 = puVar95 + 1;
    } while (puVar95 != puVar21);
  }
  puVar97 = (pMVar48->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (pMVar48->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar97 != puVar8) {
    do {
      _Var23._M_head_impl =
           (puVar97->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(_Var23._M_head_impl)->super_Importable + 0x20) == (char *)0x0) {
        Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                  ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)auStack_288,
                   &(_Var23._M_head_impl)->body);
      }
      puVar97 = puVar97 + 1;
    } while (puVar97 != puVar8);
  }
  puVar84 = (pMVar48->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  segment_1 = (pMVar48->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar84 != segment_1) {
    do {
      pEVar13 = (puVar84->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (*(char **)((long)&(pEVar13->table).super_IString + 8) != (char *)0x0) {
        Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                  ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)auStack_288,&pEVar13->offset)
        ;
      }
      ppEVar24 = *(pointer *)
                  ((long)&(pEVar13->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                  + 8);
      for (ppEVar69 = *(pointer *)
                       &(pEVar13->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl; ppEVar69 != ppEVar24; ppEVar69 = ppEVar69 + 1) {
        __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)*ppEVar69;
        Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                  ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)auStack_288,
                   (Expression **)&__range2);
      }
      puVar84 = puVar84 + 1;
    } while (puVar84 != segment_1);
  }
  puVar98 = (pMVar48->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar25 = (pMVar48->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar98 != puVar25) {
    do {
      _Var26._M_head_impl =
           (puVar98->_M_t).
           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
           super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if ((_Var26._M_head_impl)->isPassive == false) {
        Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                  ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)auStack_288,
                   &(_Var26._M_head_impl)->offset);
      }
      puVar98 = puVar98 + 1;
    } while (puVar98 != puVar25);
  }
  __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              *)&segmentReferrers._M_h._M_rehash_policy._M_next_resize;
  segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x1;
  segmentReferrers._M_h._M_bucket_count = 0;
  segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  segmentReferrers._M_h._M_element_count =
       CONCAT44(segmentReferrers._M_h._M_element_count._4_4_,0x3f800000);
  segmentReferrers._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  segmentReferrers._M_h._M_rehash_policy._4_4_ = 0;
  segmentReferrers._M_h._M_rehash_policy._M_next_resize = 0;
  pEVar13 = (this->tableManager).activeSegment;
  if (pEVar13 != (ElementSegment *)0x0) {
    ppEVar69 = (pEVar13->data).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppEVar24 = (pEVar13->data).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppEVar69 != ppEVar24) {
      do {
        auStack_118 = (undefined1  [8])*ppEVar69;
        if (*(char *)auStack_118 != '+') {
          auStack_118 = (undefined1  [8])0x0;
        }
        if ((tuple<wasm::Global_*,_std::default_delete<wasm::Global>_>)auStack_118 !=
            (_Head_base<0UL,_wasm::Global_*,_false>)0x0) {
          auStack_b8 = (undefined1  [8])&__range2;
          std::
          _Hashtable<wasm::RefFunc*,wasm::RefFunc*,std::allocator<wasm::RefFunc*>,std::__detail::_Identity,std::equal_to<wasm::RefFunc*>,std::hash<wasm::RefFunc*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<wasm::RefFunc*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::RefFunc*,false>>>>
                    ((_Hashtable<wasm::RefFunc*,wasm::RefFunc*,std::allocator<wasm::RefFunc*>,std::__detail::_Identity,std::equal_to<wasm::RefFunc*>,std::hash<wasm::RefFunc*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)auStack_b8,auStack_118,auStack_b8);
        }
        ppEVar69 = ppEVar69 + 1;
      } while (ppEVar69 != ppEVar24);
    }
  }
  local_2a0.wasm = this->primary;
  for (pDVar101 = local_170; pDVar101 != (DylinkSection *)&local_170;
      pDVar101 = *(DylinkSection **)pDVar101) {
    _Stack_138._M_p = (pointer)0x0;
    relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ppcVar90 = (char **)(pDVar101->neededDynlibs).
                        super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    pNVar27 = (pDVar101->neededDynlibs).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((pointer)ppcVar90 != pNVar27) {
      do {
        auStack_b8 = (undefined1  [8])*ppcVar90;
        if ((pointer)(((Module *)auStack_b8)->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start !=
            (pDVar101->neededDynlibs).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          __assert_fail("refFunc->func == name",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                        ,0x261,
                        "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::indirectReferencesToSecondaryFunctions()"
                       );
        }
        puVar50 = (&(__range2->
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)
                  [(ulong)auStack_b8 % (ulong)segmentReferrers._M_h._M_buckets];
        if (puVar50 != (pointer)0x0) {
          _Var19._M_head_impl =
               *(Export **)
                &(puVar50->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t;
          pMVar48 = *(Module **)((long)_Var19._M_head_impl + 8);
          do {
            if (auStack_b8 == (undefined1  [8])pMVar48) goto LAB_00748dbd;
            _Var19._M_head_impl = *(Export **)&(_Var19._M_head_impl)->name;
          } while ((_Var19._M_head_impl != (Export *)0x0) &&
                  (pMVar48 = *(Module **)((long)_Var19._M_head_impl + 8),
                  (ulong)pMVar48 % (ulong)segmentReferrers._M_h._M_buckets ==
                  (ulong)auStack_b8 % (ulong)segmentReferrers._M_h._M_buckets));
        }
        if (relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>>::
          _M_realloc_insert<wasm::RefFunc*const&>
                    ((vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>> *)&_Stack_138,
                     (iterator)
                     relevantRefFuncs.
                     super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl.
                     super__Vector_impl_data._M_start,(RefFunc **)auStack_b8);
        }
        else {
          *relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
           _M_impl.super__Vector_impl_data._M_start = (RefFunc *)auStack_b8;
          relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               relevantRefFuncs.
               super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
LAB_00748dbd:
        ppcVar90 = ppcVar90 + 1;
      } while ((pointer)ppcVar90 != pNVar27);
      if ((pointer)_Stack_138._M_p !=
          relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        pFVar56 = Module::getFunction(this->secondary,(IString)*(IString *)&pDVar101->tableAlignment
                                     );
        pMVar48 = this->primary;
        local_108._M_allocated_capacity._0_7_ = 0x6c6f706d617274;
        local_108._7_4_ = 0x5f656e69;
        params.id = 0xb;
        local_108._M_local_buf[0xb] = '\0';
        pNVar27 = (pDVar101->neededDynlibs).
                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start;
        auStack_e8 = (undefined1  [8])local_d8;
        auStack_118 = (undefined1  [8])&local_108;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_e8,pNVar27,
                   (long)&(pNVar27->super_IString).str._M_len + *(long *)&pDVar101->tableAlignment);
        puVar94 = (undefined1 *)0xf;
        if (auStack_118 != (undefined1  [8])&local_108) {
          puVar94 = (undefined1 *)
                    CONCAT17(local_108._M_local_buf[7],local_108._M_allocated_capacity._0_7_);
        }
        if (puVar94 < &copied->_id + params.id) {
          puVar95 = (pointer)0xf;
          if (auStack_e8 != (undefined1  [8])local_d8) {
            puVar95 = (pointer)local_d8._0_8_;
          }
          if (puVar95 < &copied->_id + params.id) goto LAB_00748ea7;
          puVar60 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)auStack_e8,0,(char *)0x0,(ulong)auStack_118);
        }
        else {
LAB_00748ea7:
          puVar60 = (undefined8 *)std::__cxx11::string::_M_append(auStack_118,(ulong)auStack_e8);
        }
        auStack_b8 = (undefined1  [8])&primaryFuncs._M_t._M_impl.super__Rb_tree_header;
        puVar2 = puVar60 + 2;
        if ((_Rb_tree_header *)*puVar60 == (_Rb_tree_header *)puVar2) {
          primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar2;
          primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)puVar60[3];
        }
        else {
          primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar2;
          auStack_b8 = (undefined1  [8])*puVar60;
        }
        primaryFuncs._M_t._M_impl._0_8_ = puVar60[1];
        *puVar60 = puVar2;
        puVar60[1] = 0;
        *(undefined1 *)puVar2 = 0;
        sVar105._M_str = (char *)0x0;
        sVar105._M_len = (size_t)auStack_b8;
        sVar105 = IString::interned((IString *)primaryFuncs._M_t._M_impl._0_8_,sVar105,
                                    SUB81(puVar2,0));
        NVar106 = Names::getValidFunctionName(pMVar48,(Name)sVar105);
        segment_1 = NVar106.super_IString.str._M_len;
        if (auStack_b8 != (undefined1  [8])&primaryFuncs._M_t._M_impl.super__Rb_tree_header) {
          operator_delete((void *)auStack_b8,
                          primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        }
        if (auStack_e8 != (undefined1  [8])local_d8) {
          operator_delete((void *)auStack_e8,
                          (ulong)((long)&(((__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>
                                            *)local_d8._0_8_)->
                                         super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                         )._M_t.
                                         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                         .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl
                                 + 1));
        }
        if (auStack_118 != (undefined1  [8])&local_108) {
          operator_delete((void *)auStack_118,
                          CONCAT17(local_108._M_local_buf[7],local_108._M_allocated_capacity._0_7_)
                          + 1);
        }
        auStack_b8 = (undefined1  [8])0x0;
        primaryFuncs._M_t._M_impl._0_8_ = 0;
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        uVar93 = 0;
        while( true ) {
          sVar61 = Function::getNumParams(pFVar56);
          index = (Index)uVar93;
          if (sVar61 <= uVar93) break;
          TVar62 = Function::getLocalType(pFVar56,index);
          auStack_118 = (undefined1  [8])MixedArena::allocSpace(&(local_2a0.wasm)->allocator,0x18,8)
          ;
          *(char *)auStack_118 = '\b';
          *(Index *)((long)auStack_118 + 0x10) = index;
          *(uintptr_t *)((long)auStack_118 + 8) = TVar62.id;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8,
                     (Expression **)auStack_118);
          uVar93 = (ulong)(index + 1);
        }
        NVar109.super_IString.str = *(IString *)&pDVar101->tableAlignment;
        SVar107 = HeapType::getSignature(&pFVar56->type);
        Builder::makeCall(&local_2a0,NVar109,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_b8,SVar107.results.id,false);
        pMVar48 = this->primary;
        auStack_118 = (undefined1  [8])0x0;
        params.id = 0;
        local_108._M_allocated_capacity._0_7_ = 0;
        local_108._7_4_ = local_108._7_4_ & 0xffffff00;
        name_01.super_IString.str._M_str = (char *)segment_1;
        name_01.super_IString.str._M_len = (size_t)auStack_e8;
        Builder::makeFunction
                  (name_01,(HeapType)NVar106.super_IString.str._M_str,
                   (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar56->type).id,
                   (Expression *)auStack_118);
        Module::addFunction(pMVar48,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                     *)auStack_e8);
        if (auStack_e8 != (undefined1  [8])0x0) {
          std::default_delete<wasm::Function>::operator()
                    ((default_delete<wasm::Function> *)auStack_e8,(Function *)auStack_e8);
        }
        auStack_e8 = (undefined1  [8])0x0;
        _Var44._M_p = _Stack_138._M_p;
        if ((__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)auStack_118 !=
            (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)0x0) {
          operator_delete((void *)auStack_118,
                          CONCAT17(local_108._M_local_buf[7],local_108._M_allocated_capacity._0_7_)
                          - (long)auStack_118);
          _Var44._M_p = _Stack_138._M_p;
        }
        for (; (pointer)_Var44._M_p !=
               relevantRefFuncs.
               super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl.
               super__Vector_impl_data._M_start; _Var44._M_p = (pointer)((long)_Var44._M_p + 8)) {
          pRVar70 = *(RefFunc **)_Var44._M_p;
          (pRVar70->func).super_IString.str._M_len = (size_t)segment_1;
          (pRVar70->func).super_IString.str._M_str = (char *)NVar106.super_IString.str._M_str;
        }
        if (auStack_b8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_b8,
                          primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                          (long)auStack_b8);
        }
      }
      if ((pointer)_Stack_138._M_p != (pointer)0x0) {
        operator_delete(_Stack_138._M_p,
                        (long)relevantRefFuncs.
                              super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)_Stack_138._M_p);
      }
    }
  }
  std::
  _Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&__range2);
  std::__cxx11::
  _List_base<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>
  ::_M_clear((_List_base<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>
              *)&local_170);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&_Stack_1a8);
  auStack_288._0_4_ = 0;
  auStack_288._4_4_ = 0;
  segmentReferrerCollector.wasm._0_4_ = 0;
  segmentReferrerCollector.wasm._4_4_ = 0;
  pMVar48 = this->primary;
  puVar95 = (pMVar48->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar21 = (pMVar48->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  _Stack_1a8._M_buckets = (__buckets_ptr)pMVar48;
  if (puVar95 != puVar21) {
    do {
      pGVar28 = (puVar95->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar28->super_Importable).module + 8) == (char *)0x0) {
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::walk
                  ((Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *)auStack_288,
                   &pGVar28->init);
      }
      puVar95 = puVar95 + 1;
    } while (puVar95 != puVar21);
  }
  puVar97 = (pMVar48->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (pMVar48->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar97 != puVar8) {
    do {
      pFVar56 = (puVar97->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar56->super_Importable).module + 8) == (char *)0x0) {
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::walk
                  ((Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *)auStack_288,
                   &pFVar56->body);
      }
      puVar97 = puVar97 + 1;
    } while (puVar97 != puVar8);
  }
  puVar98 = (pMVar48->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar25 = (pMVar48->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar98 != puVar25) {
    do {
      pDVar29 = (puVar98->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar29->isPassive == false) {
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::walk
                  ((Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *)auStack_288,
                   &pDVar29->offset);
      }
      puVar98 = puVar98 + 1;
    } while (puVar98 != puVar25);
  }
  primaryFuncs._M_t._M_impl._0_8_ = 0;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:670:16)>
       ::_M_invoke;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:670:16)>
       ::_M_manager;
  auStack_b8 = (undefined1  [8])this;
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)auStack_288,this->secondary,(Func *)auStack_b8);
  if (primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    (*(code *)primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_)
              (auStack_b8,auStack_b8,3);
  }
  segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&segmentReferrers;
  segmentReferrers._M_h._M_buckets =
       (__buckets_ptr)((ulong)segmentReferrers._M_h._M_buckets & 0xffffffff00000000);
  segmentReferrers._M_h._M_bucket_count = 0;
  segmentReferrers._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  segmentReferrers._M_h._M_rehash_policy._4_4_ = 0;
  p_Var49 = (_Rb_tree_node_base *)
            CONCAT44(segmentReferrerCollector._28_4_,segmentReferrerCollector._24_4_);
  segmentReferrers._M_h._M_element_count = (size_type)segmentReferrers._M_h._M_before_begin._M_nxt;
  if (p_Var49 != (_Rb_tree_node_base *)&segmentReferrerCollector.field_0x8) {
    do {
      p_Var87 = p_Var49[1]._M_left;
      auStack_118 = (undefined1  [8])&__range2;
      for (p_Var75 = p_Var49[1]._M_parent; p_Var75 != p_Var87;
          p_Var75 = (_Base_ptr)&p_Var75->_M_left) {
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::
        _M_insert_unique_<wasm::Name&,std::_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>::_Alloc_node>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)&__range2,(_Base_ptr)&segmentReferrers,(Name *)p_Var75,
                   (_Alloc_node *)auStack_118);
      }
      p_Var49 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var49);
      _Var63 = segmentReferrers._M_h._M_before_begin;
    } while (p_Var49 != (_Rb_tree_node_base *)&segmentReferrerCollector.field_0x8);
    for (; (_Rb_tree_node_base *)_Var63._M_nxt != (_Rb_tree_node_base *)&segmentReferrers;
        _Var63._M_nxt = (_Hash_node_base *)std::_Rb_tree_increment(_Var63._M_nxt)) {
      exportImportFunction(this,(Name)*(string_view *)((long)_Var63._M_nxt + 0x20));
    }
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&__range2);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
               *)&segmentReferrerCollector);
  if (((__end2._M_current)->_M_t).
      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl == (ElementSegment *)0x0)
  goto LAB_00749e38;
  segmentReferrerCollector.wasm._0_4_ = 0;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = &segmentReferrerCollector;
  segmentReferrerCollector._8_16_ = auVar42 << 0x40;
  segmentReferrerCollector._32_1_ = 0;
  segmentReferrerCollector._33_7_ = 0;
  puVar84 = (this->primary->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __end2._M_current =
       (this->primary->elementSegments).
       super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  segmentReferrerCollector._24_8_ = &segmentReferrerCollector;
  if (puVar84 != __end2._M_current) {
    do {
      pEVar13 = (puVar84->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (*(char **)((long)&(pEVar13->table).super_IString + 8) != (char *)0x0) {
        IString::interned((IString *)0x0,(string_view)ZEXT816(0xe67796),SUB81(puVar84,0));
        pEVar72 = pEVar13->offset;
        local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        if (pEVar72->_id == ConstId) {
          if (*(long *)(pEVar72 + 2) != 2) {
LAB_0074a45d:
            __assert_fail("type == Type::i32",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                          ,0x120,"int32_t wasm::Literal::geti32() const");
          }
          local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(ulong)*(uint *)(pEVar72 + 1);
        }
        puVar85 = *(unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> **)
                   &(pEVar13->data).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl;
        if (*(unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> **)
             ((long)&(pEVar13->data).
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> + 8
             ) != puVar85) {
          uVar93 = 0;
          do {
            uVar88 = (int)uVar93 + (int)local_c8;
            _Stack_138._M_p._0_4_ = uVar88;
            pEVar68 = puVar85[uVar93]._M_t.
                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
            segment_1 = puVar85;
            if (*(Id *)&(pEVar68->super_Named).name == RefFuncId) {
              p_Var30 = &this->secondaryFuncs->_M_t;
              __k = &(pEVar68->super_Named).hasExplicitName;
              cVar64 = std::
                       _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       ::find(p_Var30,(key_type *)__k);
              if ((_Rb_tree_header *)cVar64._M_node != &(p_Var30->_M_impl).super__Rb_tree_header) {
                __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            *)(ulong)uVar88;
                pmVar65 = std::
                          map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                          ::operator[]((map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                                        *)local_150,(key_type_conflict *)&__range2);
                pcVar11 = *(char **)&(pEVar68->table).super_IString.str;
                (pmVar65->super_IString).str._M_len = *(size_t *)__k;
                (pmVar65->super_IString).str._M_str = pcVar11;
                pFVar56 = Module::getFunction(this->secondary,
                                              (IString)*(IString *)
                                                        &(pEVar68->super_Named).hasExplicitName);
                ppFVar66 = std::
                           map<unsigned_int,_wasm::Function_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
                           ::operator[]((map<unsigned_int,_wasm::Function_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
                                         *)auStack_288,(key_type *)&_Stack_138);
                *ppFVar66 = pFVar56;
                if (this->config->usePlaceholders == false) {
                  __range2 = &this->primary->exports;
                  pEVar68 = (ElementSegment *)
                            Builder::makeRefNull((Builder *)&__range2,(HeapType)0x68);
                  segment_1[uVar93]._M_t.
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar68;
                }
                else {
                  __s = (Function *)operator_new(0x1d8);
                  memset(__s,0,0x1d8);
                  HeapType::HeapType(&__s->type,(Signature)ZEXT816(0));
                  __s->profile = Normal;
                  (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  __s->body = (Expression *)0x0;
                  (__s->localNames)._M_h._M_buckets = &(__s->localNames)._M_h._M_single_bucket;
                  uVar86 = 1;
                  (__s->localNames)._M_h._M_bucket_count = 1;
                  (__s->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                  (__s->localNames)._M_h._M_element_count = 0;
                  (__s->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
                  (__s->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
                  (__s->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                  (__s->localIndices)._M_h._M_buckets = &(__s->localIndices)._M_h._M_single_bucket;
                  (__s->localIndices)._M_h._M_bucket_count = 1;
                  (__s->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                  (__s->localIndices)._M_h._M_element_count = 0;
                  (__s->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
                  (__s->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
                  (__s->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                  (__s->debugLocations)._M_h._M_buckets =
                       &(__s->debugLocations)._M_h._M_single_bucket;
                  (__s->debugLocations)._M_h._M_bucket_count = 1;
                  (__s->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                  (__s->debugLocations)._M_h._M_element_count = 0;
                  (__s->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
                  (__s->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
                  (__s->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                  (__s->prologLocation).
                  super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
                  (__s->epilogLocation).
                  super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
                  (__s->expressionLocations)._M_h._M_buckets =
                       &(__s->expressionLocations)._M_h._M_single_bucket;
                  (__s->expressionLocations)._M_h._M_bucket_count = 1;
                  (__s->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                  (__s->expressionLocations)._M_h._M_element_count = 0;
                  (__s->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
                  (__s->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
                  (__s->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                  (__s->delimiterLocations)._M_h._M_buckets =
                       &(__s->delimiterLocations)._M_h._M_single_bucket;
                  (__s->delimiterLocations)._M_h._M_bucket_count = 1;
                  (__s->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                  (__s->delimiterLocations)._M_h._M_element_count = 0;
                  (__s->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
                  *(undefined8 *)((long)&(__s->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
                  (__s->funcLocation).declarations = 0;
                  (__s->funcLocation).end = 0;
                  (__s->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
                  (__s->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                  (__s->effects).
                  super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  (__s->effects).
                  super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  __s->noFullInline = false;
                  __s->noPartialInline = false;
                  pcVar11 = (this->config->placeholderNamespace).super_IString.str._M_str;
                  (__s->super_Importable).module.super_IString.str._M_len =
                       (this->config->placeholderNamespace).super_IString.str._M_len;
                  (__s->super_Importable).module.super_IString.str._M_str = pcVar11;
                  uVar88 = (_Rb_tree_color)_Stack_138._M_p;
                  cVar47 = '\x01';
                  p_Var6 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header;
                  if (9 < (_Rb_tree_color)_Stack_138._M_p) {
                    uVar86 = (ulong)_Stack_138._M_p & 0xffffffff;
                    cVar46 = '\x04';
                    do {
                      cVar47 = cVar46;
                      uVar78 = (uint)uVar86;
                      if (uVar78 < 100) {
                        cVar47 = cVar47 + -2;
                        goto LAB_007496fc;
                      }
                      if (uVar78 < 1000) {
                        cVar47 = cVar47 + -1;
                        goto LAB_007496fc;
                      }
                      if (uVar78 < 10000) goto LAB_007496fc;
                      uVar86 = uVar86 / 10000;
                      cVar46 = cVar47 + '\x04';
                    } while (99999 < uVar78);
                    cVar47 = cVar47 + '\x01';
                  }
LAB_007496fc:
                  uVar76 = (undefined1)uVar86;
                  __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              *)&segmentReferrers._M_h._M_bucket_count;
                  auStack_e8 = (undefined1  [8])__s;
                  std::__cxx11::string::_M_construct((ulong)&__range2,cVar47);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)__range2,(uint)segmentReferrers._M_h._M_buckets,uVar88);
                  sVar104._M_str = (char *)0x0;
                  sVar104._M_len = (size_t)__range2;
                  sVar105 = IString::interned((IString *)segmentReferrers._M_h._M_buckets,sVar104,
                                              (bool)uVar76);
                  *(string_view *)((long)auStack_e8 + 0x28) = sVar105;
                  if (__range2 !=
                      (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       *)&segmentReferrers._M_h._M_bucket_count) {
                    operator_delete(__range2,segmentReferrers._M_h._M_bucket_count + 1);
                    sVar105 = *(string_view *)((long)auStack_e8 + 0x28);
                  }
                  pMVar48 = this->primary;
                  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x63616c70;
                  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x6c6f6865;
                  primaryFuncs._M_t._M_impl._0_8_ = 0xc;
                  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)
                       CONCAT35(primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                _5_3_,0x5f726564);
                  auStack_118 = (undefined1  [8])&local_108;
                  auStack_b8 = (undefined1  [8])p_Var6;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)auStack_118,sVar105._M_str,sVar105._M_str + sVar105._M_len);
                  uVar86 = 0xf;
                  if (auStack_b8 != (undefined1  [8])p_Var6) {
                    uVar86 = primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                  }
                  if (uVar86 < params.id + primaryFuncs._M_t._M_impl._0_8_) {
                    uVar86 = 0xf;
                    if (auStack_118 != (undefined1  [8])&local_108) {
                      uVar86 = CONCAT17(local_108._M_local_buf[7],
                                        local_108._M_allocated_capacity._0_7_);
                    }
                    if (uVar86 < params.id + primaryFuncs._M_t._M_impl._0_8_) goto LAB_00749803;
                    plVar67 = (long *)std::__cxx11::string::replace
                                                ((ulong)auStack_118,0,(char *)0x0,(ulong)auStack_b8)
                    ;
                  }
                  else {
LAB_00749803:
                    plVar67 = (long *)std::__cxx11::string::_M_append(auStack_b8,(ulong)auStack_118)
                    ;
                  }
                  __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              *)&segmentReferrers._M_h._M_bucket_count;
                  pvVar3 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            *)(plVar67 + 2);
                  if ((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       *)*plVar67 == pvVar3) {
                    segmentReferrers._M_h._M_bucket_count =
                         (size_type)
                         (pvVar3->
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                    segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)plVar67[3];
                  }
                  else {
                    segmentReferrers._M_h._M_bucket_count =
                         (size_type)
                         (pvVar3->
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                    __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                *)*plVar67;
                  }
                  segmentReferrers._M_h._M_buckets = (__buckets_ptr)plVar67[1];
                  *plVar67 = (long)pvVar3;
                  plVar67[1] = 0;
                  *(undefined1 *)
                   &(pvVar3->
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start = 0;
                  s._M_str = (char *)0x0;
                  s._M_len = (size_t)__range2;
                  sVar105 = IString::interned((IString *)segmentReferrers._M_h._M_buckets,s,
                                              SUB81(pvVar3,0));
                  IVar108.str = (string_view)Names::getValidFunctionName(pMVar48,sVar105);
                  *(string_view *)auStack_e8 = IVar108.str;
                  if (__range2 !=
                      (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       *)&segmentReferrers._M_h._M_bucket_count) {
                    operator_delete(__range2,segmentReferrers._M_h._M_bucket_count + 1);
                  }
                  if (auStack_118 != (undefined1  [8])&local_108) {
                    operator_delete((void *)auStack_118,
                                    CONCAT17(local_108._M_local_buf[7],
                                             local_108._M_allocated_capacity._0_7_) + 1);
                  }
                  if (auStack_b8 != (undefined1  [8])p_Var6) {
                    operator_delete((void *)auStack_b8,
                                    primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
                                    + 1);
                  }
                  *(bool *)((long)auStack_e8 + 0x10) = true;
                  HVar31.id = (pFVar56->type).id;
                  ((HeapType *)((long)auStack_e8 + 0x38))->id = HVar31.id;
                  sVar61 = *(size_t *)auStack_e8;
                  pcVar11 = *(char **)((long)auStack_e8 + 8);
                  pEVar68 = (ElementSegment *)
                            MixedArena::allocSpace(&this->primary->allocator,0x20,8);
                  *(Id *)&(pEVar68->super_Named).name = RefFuncId;
                  ((Type *)((long)&(pEVar68->super_Named).name + 8))->id = 0;
                  (((Name *)&(pEVar68->super_Named).hasExplicitName)->super_IString).str._M_len =
                       sVar61;
                  *(char **)&(pEVar68->table).super_IString.str = pcVar11;
                  RefFunc::finalize((RefFunc *)pEVar68,HVar31);
                  segment_1[uVar93]._M_t.
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar68;
                  Module::addFunction(this->primary,
                                      (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                       *)auStack_e8);
                  if (auStack_e8 != (undefined1  [8])0x0) {
                    std::default_delete<wasm::Function>::operator()
                              ((default_delete<wasm::Function> *)auStack_e8,(Function *)auStack_e8);
                  }
                }
              }
            }
            uVar93 = (ulong)((int)uVar93 + 1);
            puVar85 = *(unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                        **)&(pEVar13->data).
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl;
          } while (uVar93 < (ulong)((long)*(pointer *)
                                           ((long)&(pEVar13->data).
                                                                                                      
                                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                           + 8) - (long)puVar85 >> 3));
        }
      }
      puVar84 = puVar84 + 1;
    } while (puVar84 != __end2._M_current);
    if (CONCAT71(segmentReferrerCollector._33_7_,segmentReferrerCollector._32_1_) != 0) {
      auStack_118 = (undefined1  [8])
                    wasm::ModuleUtils::copyTable((this->tableManager).activeTable,this->secondary);
      if ((this->tableManager).activeBase.global.super_IString.str._M_len == 0) {
        _Stack_138._M_p._0_4_ = *(undefined4 *)(segmentReferrerCollector._16_8_ + 0x20);
        auStack_b8 = (undefined1  [8])0x0;
        primaryFuncs._M_t._M_impl._0_8_ = 0;
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        segmentReferrers._M_h._M_buckets = (__buckets_ptr)&_Stack_138;
        segmentReferrers._M_h._M_bucket_count = (size_type)auStack_118;
        segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)auStack_b8;
        p_Var49 = (_Rb_tree_node_base *)segmentReferrerCollector._16_8_;
        __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)this;
        if ((ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
             *)segmentReferrerCollector._16_8_ == &segmentReferrerCollector) goto LAB_00749e2c;
        do {
          if ((primaryFuncs._M_t._M_impl._0_8_ - (long)auStack_b8 >> 3) +
              ((ulong)_Stack_138._M_p & 0xffffffff) != (ulong)p_Var49[1]._M_color) {
            setupTablePatching::anon_class_32_4_bf007958::operator()
                      ((anon_class_32_4_bf007958 *)&__range2);
            _Stack_138._M_p._0_4_ = p_Var49[1]._M_color;
            if ((undefined1  [8])primaryFuncs._M_t._M_impl._0_8_ != auStack_b8) {
              primaryFuncs._M_t._M_impl._0_8_ = auStack_b8;
            }
          }
          p_Var75 = p_Var49[1]._M_parent;
          uVar16 = *(undefined8 *)p_Var75;
          p_Var87 = p_Var75->_M_parent;
          HVar31.id = (uintptr_t)p_Var75[1]._M_right;
          pFVar56 = (Function *)MixedArena::allocSpace(&this->secondary->allocator,0x20,8);
          *(Id *)&(pFVar56->super_Importable).super_Named.name.super_IString.str._M_len = RefFuncId;
          ((Type *)&(pFVar56->super_Importable).super_Named.name.super_IString.str._M_str)->id = 0;
          *(undefined8 *)&(pFVar56->super_Importable).super_Named.hasExplicitName = uVar16;
          (pFVar56->super_Importable).module.super_IString.str._M_len = (size_t)p_Var87;
          RefFunc::finalize((RefFunc *)pFVar56,HVar31);
          auStack_e8 = (undefined1  [8])pFVar56;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8,
                     (Expression **)auStack_e8);
          p_Var49 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var49);
        } while (p_Var49 != (_Rb_tree_node_base *)&segmentReferrerCollector);
        if ((undefined1  [8])primaryFuncs._M_t._M_impl._0_8_ != auStack_b8) {
          setupTablePatching::anon_class_32_4_bf007958::operator()
                    ((anon_class_32_4_bf007958 *)&__range2);
        }
      }
      else {
        ppEVar100 = (this->tableManager).activeTableSegments.
                    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        if ((long)(this->tableManager).activeTableSegments.
                  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar100 != 8) {
          __assert_fail("tableManager.activeTableSegments.size() == 1 && \"Unexpected number of segments with non-const base\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                        ,0x2ee,
                        "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::setupTablePatching()"
                       );
        }
        pMVar48 = this->secondary;
        if (((long)(pMVar48->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pMVar48->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != 8) ||
           ((pMVar48->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pMVar48->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          __assert_fail("secondary.tables.size() == 1 && secondary.elementSegments.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                        ,0x2ef,
                        "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::setupTablePatching()"
                       );
        }
        pEVar13 = *ppEVar100;
        auStack_b8 = (undefined1  [8])0x0;
        primaryFuncs._M_t._M_impl._0_8_ = 0;
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)auStack_118;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::reserve
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_b8,
                   (long)*(pointer *)
                          ((long)&(pEVar13->data).
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl + 8) -
                   *(long *)&(pEVar13->data).
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data >> 3);
        ppEVar69 = (pEVar13->data).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if ((ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
             *)segmentReferrerCollector._16_8_ != &segmentReferrerCollector &&
            *(pointer *)
             ((long)&(pEVar13->data).
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl + 8) != ppEVar69) {
          uVar88 = 1;
          uVar93 = 0;
          pPVar71 = (ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                     *)segmentReferrerCollector._16_8_;
          do {
            if (uVar88 - 1 == *(int *)&pPVar71->field_0x20) {
              psVar52 = *(size_t **)&pPVar71->field_0x28;
              sVar61 = *psVar52;
              pcVar11 = (char *)psVar52[1];
              HVar31.id = psVar52[7];
              segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                           *)pPVar71;
              pRVar70 = (RefFunc *)MixedArena::allocSpace(&this->secondary->allocator,0x20,8);
              (pRVar70->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id =
                   RefFuncId;
              (pRVar70->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id
                   = 0;
              (pRVar70->func).super_IString.str._M_len = sVar61;
              (pRVar70->func).super_IString.str._M_str = pcVar11;
              RefFunc::finalize(pRVar70,HVar31);
              __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          *)pRVar70;
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8,
                         (Expression **)&__range2);
              pPVar71 = (ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                         *)std::_Rb_tree_increment((_Rb_tree_node_base *)segment_1);
            }
            else if (ppEVar69[uVar93]->_id == RefFuncId) {
              exportImportFunction(this,(Name)ppEVar69[uVar93][1]);
              __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          *)0x0;
              segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x0;
              segmentReferrers._M_h._M_before_begin._M_nxt =
                   (_Hash_node_base *)
                   std::
                   _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                   ::_M_invoke;
              segmentReferrers._M_h._M_bucket_count =
                   (size_type)
                   std::
                   _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                   ::_M_manager;
              pFVar56 = (Function *)
                        ExpressionManipulator::flexibleCopy
                                  (*(Expression **)
                                    (*(long *)&(pEVar13->data).
                                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                               ._M_impl.super__Vector_impl_data + uVar93 * 8),
                                   this->secondary,(CustomCopier *)&__range2);
              if (segmentReferrers._M_h._M_bucket_count != 0) {
                (*(code *)segmentReferrers._M_h._M_bucket_count)(&__range2,&__range2,3);
              }
              auStack_e8 = (undefined1  [8])pFVar56;
              if (primaryFuncs._M_t._M_impl._0_8_ ==
                  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_) {
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                _M_realloc_insert<wasm::Expression*const&>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8
                           ,(iterator)primaryFuncs._M_t._M_impl._0_8_,(Expression **)auStack_e8);
              }
              else {
                *(Function **)primaryFuncs._M_t._M_impl._0_8_ = pFVar56;
                primaryFuncs._M_t._M_impl._0_8_ = primaryFuncs._M_t._M_impl._0_8_ + 8;
              }
            }
            if (pPVar71 == &segmentReferrerCollector) break;
            uVar93 = (ulong)uVar88;
            ppEVar69 = (pEVar13->data).
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            uVar88 = uVar88 + 1;
          } while (uVar93 < (ulong)((long)*(pointer *)
                                           ((long)&(pEVar13->data).
                                                                                                      
                                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                  ._M_impl + 8) - (long)ppEVar69 >> 3));
        }
        __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)0x0;
        segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x0;
        segmentReferrers._M_h._M_before_begin._M_nxt =
             (_Hash_node_base *)
             std::
             _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
             ::_M_invoke;
        segmentReferrers._M_h._M_bucket_count =
             (size_type)
             std::
             _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
             ::_M_manager;
        pEVar72 = ExpressionManipulator::flexibleCopy
                            (pEVar13->offset,this->secondary,(CustomCopier *)&__range2);
        paVar57 = local_c8;
        if (segmentReferrers._M_h._M_bucket_count != 0) {
          (*(code *)segmentReferrers._M_h._M_bucket_count)(&__range2,&__range2,3);
        }
        __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)operator_new(0x50);
        puVar17 = *(pointer *)((long)paVar57 + 8);
        puVar50 = *(pointer *)((long)paVar57->_M_local_buf + 0x50);
        __range2[1].
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar57->_M_allocated_capacity;
        __range2[1].
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar17;
        __range2[1].
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pEVar72;
        __range2[2].
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = puVar50;
        __range2[2].
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_b8;
        __range2[2].
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)primaryFuncs._M_t._M_impl._0_8_;
        __range2[3].
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        auStack_b8 = (undefined1  [8])0x0;
        primaryFuncs._M_t._M_impl._0_8_ = 0;
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        puVar50 = *(pointer *)((long)&(pEVar13->super_Named).name.super_IString + 8);
        bVar103 = (pEVar13->super_Named).hasExplicitName;
        (__range2->
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)&(pEVar13->super_Named).name.super_IString;
        (__range2->
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = puVar50;
        *(bool *)&(__range2->
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage = bVar103;
        Module::addElementSegment
                  (this->secondary,
                   (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                   &__range2);
        if (__range2 !=
            (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             *)0x0) {
          std::default_delete<wasm::ElementSegment>::operator()
                    ((default_delete<wasm::ElementSegment> *)&__range2,(ElementSegment *)__range2);
        }
      }
      if (auStack_b8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_b8,
                        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                        (long)auStack_b8);
      }
    }
  }
LAB_00749e2c:
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
               *)auStack_288);
LAB_00749e38:
  auStack_288 = (undefined1  [8])&segmentReferrerCollector.field_0x28;
  segmentReferrerCollector.wasm._0_4_ = 1;
  segmentReferrerCollector.wasm._4_4_ = 0;
  segmentReferrerCollector._8_16_ = ZEXT816(0);
  segmentReferrerCollector._24_4_ = 0x3f800000;
  segmentReferrerCollector._32_1_ = 0;
  segmentReferrerCollector._33_7_ = 0;
  segmentReferrerCollector._40_1_ = 0;
  segmentReferrerCollector._41_2_ = 0;
  segmentReferrerCollector._43_1_ = 0;
  segmentReferrerCollector._44_4_ = 0;
  pMVar48 = this->primary;
  puVar50 = (pMVar48->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar17 = (pMVar48->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar50 != puVar17) {
    do {
      pEVar53 = (puVar50->_M_t).
                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if ((pEVar53->kind != Function) &&
         (*(__index_type *)
           ((long)&(pEVar53->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0')
         ) {
        __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)CONCAT44(__range2._4_4_,pEVar53->kind);
        segmentReferrers._M_h._M_buckets =
             *(__buckets_ptr *)
              &(pEVar53->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
               super__Move_assign_alias<wasm::Name,_wasm::HeapType>;
        segmentReferrers._M_h._M_bucket_count =
             *(size_type *)
              ((long)&(pEVar53->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8);
        pmVar73 = std::__detail::
                  _Map_base<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)auStack_288,(key_type *)&__range2);
        pcVar11 = *(char **)((long)&(pEVar53->name).super_IString + 8);
        (pmVar73->super_IString).str._M_len = *(size_t *)&(pEVar53->name).super_IString;
        (pmVar73->super_IString).str._M_str = pcVar11;
      }
      puVar50 = puVar50 + 1;
    } while (puVar50 != puVar17);
    pMVar48 = this->primary;
  }
  primaryFuncs._M_t._M_impl._0_8_ = auStack_288;
  puVar102 = (pMVar48->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  puVar32 = (pMVar48->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  auStack_b8 = (undefined1  [8])this;
  if (puVar102 != puVar32) {
    psVar4 = &segmentReferrers._M_h._M_bucket_count;
    do {
      secondaryItem =
           wasm::ModuleUtils::copyMemory
                     ((puVar102->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,this->secondary);
      segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x6;
      segmentReferrers._M_h._M_bucket_count =
           CONCAT17(segmentReferrers._M_h._M_bucket_count._7_1_,0x79726f6d656d);
      __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  *)psVar4;
      shareImportableItems::anon_class_16_2_802485ec::operator()
                ((anon_class_16_2_802485ec *)auStack_b8,
                 &((puVar102->_M_t).
                   super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->super_Importable,
                 &secondaryItem->super_Importable,(string *)&__range2,Memory);
      if (__range2 !=
          (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           *)psVar4) {
        operator_delete(__range2,segmentReferrers._M_h._M_bucket_count + 1);
      }
      puVar102 = puVar102 + 1;
    } while (puVar102 != puVar32);
    pMVar48 = this->primary;
  }
  puVar81 = (pMVar48->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (pMVar48->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar81 != puVar10) {
    psVar4 = &segmentReferrers._M_h._M_bucket_count;
    do {
      pTVar74 = Module::getTableOrNull
                          (this->secondary,
                           (IString)*(IString *)
                                     &(((puVar81->_M_t).
                                        super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                        .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                                      super_Importable).super_Named);
      if (pTVar74 == (Table *)0x0) {
        pTVar74 = wasm::ModuleUtils::copyTable
                            ((puVar81->_M_t).
                             super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                             .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl,
                             this->secondary);
      }
      segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x5;
      segmentReferrers._M_h._M_bucket_count =
           CONCAT26(segmentReferrers._M_h._M_bucket_count._6_2_,0x656c626174);
      __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  *)psVar4;
      shareImportableItems::anon_class_16_2_802485ec::operator()
                ((anon_class_16_2_802485ec *)auStack_b8,
                 &((puVar81->_M_t).
                   super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->super_Importable,
                 &pTVar74->super_Importable,(string *)&__range2,Table);
      if (__range2 !=
          (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           *)psVar4) {
        operator_delete(__range2,segmentReferrers._M_h._M_bucket_count + 1);
      }
      puVar81 = puVar81 + 1;
    } while (puVar81 != puVar10);
    pMVar48 = this->primary;
  }
  puVar95 = (pMVar48->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar21 = (pMVar48->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar95 != puVar21) {
    psVar4 = &segmentReferrers._M_h._M_bucket_count;
    do {
      if ((((puVar95->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->mutable_ == true) &&
         (((this->primary->features).features & 2) == 0)) {
        __assert_fail("primary.features.hasMutableGlobals() && \"TODO: add wrapper functions for disallowed mutable globals\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                      ,0x369,
                      "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::shareImportableItems()"
                     );
      }
      auStack_118 = (undefined1  [8])operator_new(0x50);
      *(size_type *)((long)auStack_118 + 0x40) = 0;
      (((vector<wasm::Type,_std::allocator<wasm::Type>_> *)((long)auStack_118 + 0x48))->
      super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)auStack_118 + 0x30))->_M_allocated_capacity = 0;
      ((_Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        *)((long)auStack_118 + 0x38))->_M_buckets = (__buckets_ptr)0x0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)auStack_118 + 0x20))->_M_allocated_capacity = 0;
      (((Name *)((long)auStack_118 + 0x28))->super_IString).str._M_len = 0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)auStack_118 + 0x10))->_M_allocated_capacity = 0;
      (((Name *)((long)auStack_118 + 0x18))->super_IString).str._M_len = 0;
      *(size_type *)auStack_118 = 0;
      *(char **)((long)auStack_118 + 8) = (char *)0x0;
      pGVar28 = (puVar95->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      ((_Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        *)((long)auStack_118 + 0x38))->_M_buckets = (__buckets_ptr)(pGVar28->type).id;
      *(bool *)&(((vector<wasm::Type,_std::allocator<wasm::Type>_> *)((long)auStack_118 + 0x48))->
                super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                super__Vector_impl_data._M_start = pGVar28->mutable_;
      if (pGVar28->init == (Expression *)0x0) {
        p_Var75 = (_Base_ptr)0x0;
      }
      else {
        __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)0x0;
        segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x0;
        segmentReferrers._M_h._M_before_begin._M_nxt =
             (_Hash_node_base *)
             std::
             _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
             ::_M_invoke;
        segmentReferrers._M_h._M_bucket_count =
             (size_type)
             std::
             _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
             ::_M_manager;
        p_Var75 = (_Base_ptr)
                  ExpressionManipulator::flexibleCopy
                            (pGVar28->init,this->secondary,(CustomCopier *)&__range2);
        if (segmentReferrers._M_h._M_bucket_count != 0) {
          (*(code *)segmentReferrers._M_h._M_bucket_count)
                    ((string *)&__range2,(string *)&__range2,3);
        }
      }
      *(_Base_ptr *)((long)auStack_118 + 0x40) = p_Var75;
      segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x6;
      segmentReferrers._M_h._M_bucket_count =
           CONCAT17(segmentReferrers._M_h._M_bucket_count._7_1_,0x6c61626f6c67);
      __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  *)psVar4;
      shareImportableItems::anon_class_16_2_802485ec::operator()
                ((anon_class_16_2_802485ec *)auStack_b8,
                 &((puVar95->_M_t).
                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->super_Importable,
                 (Importable *)auStack_118,(string *)&__range2,Global);
      if (__range2 !=
          (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           *)psVar4) {
        operator_delete(__range2,segmentReferrers._M_h._M_bucket_count + 1);
      }
      Module::addGlobal(this->secondary,
                        (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)auStack_118)
      ;
      if ((__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)auStack_118 !=
          (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)0x0) {
        operator_delete((void *)auStack_118,0x50);
      }
      puVar95 = puVar95 + 1;
    } while (puVar95 != puVar21);
    pMVar48 = this->primary;
  }
  puVar99 = (pMVar48->tags).
            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar33 = (pMVar48->tags).
            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar99 != puVar33) {
    psVar4 = &segmentReferrers._M_h._M_bucket_count;
    do {
      auStack_118 = (undefined1  [8])operator_new(0x40);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)auStack_118 + 0x20))->_M_allocated_capacity = 0;
      (((Name *)((long)auStack_118 + 0x28))->super_IString).str._M_len = 0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)auStack_118 + 0x10))->_M_allocated_capacity = 0;
      (((Name *)((long)auStack_118 + 0x18))->super_IString).str._M_len = 0;
      *(size_type *)auStack_118 = 0;
      *(char **)((long)auStack_118 + 8) = (char *)0x0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)auStack_118 + 0x30))->_M_allocated_capacity = 0;
      ((_Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        *)((long)auStack_118 + 0x38))->_M_buckets = (__buckets_ptr)0x10;
      primaryItem = (puVar99->_M_t).
                    super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                    super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      ((_Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        *)((long)auStack_118 + 0x38))->_M_buckets = (__buckets_ptr)(primaryItem->type).id;
      segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x3;
      segmentReferrers._M_h._M_bucket_count =
           CONCAT44(segmentReferrers._M_h._M_bucket_count._4_4_,0x676174);
      __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  *)psVar4;
      shareImportableItems::anon_class_16_2_802485ec::operator()
                ((anon_class_16_2_802485ec *)auStack_b8,&primaryItem->super_Importable,
                 (Importable *)auStack_118,(string *)&__range2,Tag);
      if (__range2 !=
          (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           *)psVar4) {
        operator_delete(__range2,segmentReferrers._M_h._M_bucket_count + 1);
      }
      Module::addTag(this->secondary,
                     (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)auStack_118);
      if ((__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)auStack_118 !=
          (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)0x0) {
        operator_delete((void *)auStack_118,0x40);
      }
      puVar99 = puVar99 + 1;
    } while (puVar99 != puVar33);
  }
  std::
  _Hashtable<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)auStack_288);
  pMVar48 = this->secondary;
  auStack_288._0_4_ = 0x10714e0;
  auStack_288._4_4_ = 0;
  segmentReferrerCollector.wasm._0_4_ = SUB84(pMVar48,0);
  segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pMVar48 >> 0x20);
  segmentReferrerCollector._16_8_ = 0;
  segmentReferrerCollector._8_8_ = &pMVar48->allocator;
  segmentReferrerCollector._24_4_ = 0;
  segmentReferrerCollector._28_4_ = 0;
  segmentReferrerCollector._32_1_ = 0;
  segmentReferrerCollector._33_7_ = 0;
  segmentReferrerCollector._40_1_ = 0;
  segmentReferrerCollector._41_2_ = 0x101;
  segmentReferrerCollector._44_4_ = 0;
  segmentReferrerCollector._48_4_ = 0;
  segmentReferrerCollector._52_4_ = 2;
  IStack_248 = 0xffffffff;
  _Stack_1a8._M_buckets = (__buckets_ptr)0x0;
  _Stack_1a8._M_bucket_count = _Stack_1a8._M_bucket_count & 0xffffffffffff0000;
  p_Var6 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header;
  __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              *)0x1d;
  auStack_b8 = (undefined1  [8])p_Var6;
  auStack_b8 = (undefined1  [8])
               std::__cxx11::string::_M_create((ulong *)auStack_b8,(ulong)&__range2);
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = __range2;
  *(undefined8 *)((long)auStack_b8 + 0xd) = 0x2d656c75646f6d2d;
  *(undefined8 *)((long)auStack_b8 + 0x15) = 0x73746e656d656c65;
  *(undefined8 *)auStack_b8 = 0x752d65766f6d6572;
  *(undefined8 *)((long)auStack_b8 + 8) = 0x6f6d2d646573756e;
  primaryFuncs._M_t._M_impl._0_8_ = __range2;
  *(char *)((long)auStack_b8 + (long)__range2) = '\0';
  segmentReferrers._M_h._M_element_count =
       segmentReferrers._M_h._M_element_count & 0xffffffffffffff00;
  PassRunner::add((PassRunner *)auStack_288,(string *)auStack_b8,
                  (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&__range2);
  if (((char)segmentReferrers._M_h._M_element_count == '\x01') &&
     (segmentReferrers._M_h._M_element_count =
           segmentReferrers._M_h._M_element_count & 0xffffffffffffff00,
     __range2 !=
     (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      *)&segmentReferrers._M_h._M_bucket_count)) {
    operator_delete(__range2,segmentReferrers._M_h._M_bucket_count + 1);
  }
  if (auStack_b8 != (undefined1  [8])p_Var6) {
    operator_delete((void *)auStack_b8,
                    primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  PassRunner::run((PassRunner *)auStack_288);
  PassRunner::~PassRunner((PassRunner *)auStack_288);
  return;
}

Assistant:

ModuleSplitter(Module& primary, const Config& config)
    : config(config), secondaryPtr(initSecondary(primary)), primary(primary),
      secondary(*secondaryPtr),
      classifiedFuncs(classifyFunctions(primary, config)),
      primaryFuncs(classifiedFuncs.first),
      secondaryFuncs(classifiedFuncs.second), tableManager(primary),
      exportedPrimaryFuncs(initExportedPrimaryFuncs(primary)) {
    if (config.jspi) {
      setupJSPI();
    }
    moveSecondaryFunctions();
    thunkExportedSecondaryFunctions();
    indirectReferencesToSecondaryFunctions();
    indirectCallsToSecondaryFunctions();
    exportImportCalledPrimaryFunctions();
    setupTablePatching();
    shareImportableItems();
    removeUnusedSecondaryElements();
  }